

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::ashrSlowCase(APInt *this,uint ShiftAmt)

{
  ulong *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint64_t uVar4;
  uint i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  if (ShiftAmt == 0) {
    return;
  }
  bVar3 = isNegative(this);
  uVar11 = ShiftAmt >> 6;
  iVar9 = (int)((ulong)this->BitWidth + 0x3f >> 6);
  uVar8 = iVar9 - uVar11;
  if (uVar8 != 0) {
    uVar12 = ShiftAmt & 0x3f;
    uVar10 = iVar9 - 1;
    uVar4 = SignExtend64((this->U).pVal[uVar10],(this->BitWidth - 1 & 0x3f) + 1);
    (this->U).pVal[(int)((ulong)this->BitWidth + 0x3f >> 6) - 1] = uVar4;
    if (uVar12 == 0) {
      memmove((this->U).pVal,(this->U).pVal + uVar11,(ulong)(uVar8 * 8));
    }
    else {
      uVar6 = (ulong)(uVar8 - 1);
      uVar5 = 0;
      uVar7 = (ulong)uVar11;
      while( true ) {
        puVar2 = (this->U).pVal;
        if (uVar6 == uVar5) break;
        puVar1 = puVar2 + uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
        puVar2[uVar5] = puVar2[uVar7] << ((byte)(0x40 - uVar12) & 0x3f) | *puVar1 >> (sbyte)uVar12;
        uVar5 = uVar5 + 1;
      }
      puVar2[uVar6] = puVar2[uVar10] >> (sbyte)uVar12;
      uVar4 = SignExtend64((this->U).pVal[uVar6],0x40 - uVar12);
      (this->U).pVal[uVar6] = uVar4;
    }
  }
  memset((this->U).pVal + uVar8,-(uint)bVar3,(ulong)(uVar11 << 3));
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::ashrSlowCase(unsigned ShiftAmt) {
  // Don't bother performing a no-op shift.
  if (!ShiftAmt)
    return;

  // Save the original sign bit for later.
  bool Negative = isNegative();

  // WordShift is the inter-part shift; BitShift is intra-part shift.
  unsigned WordShift = ShiftAmt / APINT_BITS_PER_WORD;
  unsigned BitShift = ShiftAmt % APINT_BITS_PER_WORD;

  unsigned WordsToMove = getNumWords() - WordShift;
  if (WordsToMove != 0) {
    // Sign extend the last word to fill in the unused bits.
    U.pVal[getNumWords() - 1] = SignExtend64(
        U.pVal[getNumWords() - 1], ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

    // Fastpath for moving by whole words.
    if (BitShift == 0) {
      std::memmove(U.pVal, U.pVal + WordShift, WordsToMove * APINT_WORD_SIZE);
    } else {
      // Move the words containing significant bits.
      for (unsigned i = 0; i != WordsToMove - 1; ++i)
        U.pVal[i] = (U.pVal[i + WordShift] >> BitShift) |
                    (U.pVal[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift));

      // Handle the last word which has no high bits to copy.
      U.pVal[WordsToMove - 1] = U.pVal[WordShift + WordsToMove - 1] >> BitShift;
      // Sign extend one more time.
      U.pVal[WordsToMove - 1] =
          SignExtend64(U.pVal[WordsToMove - 1], APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder based on the original sign.
  std::memset(U.pVal + WordsToMove, Negative ? -1 : 0,
              WordShift * APINT_WORD_SIZE);
  clearUnusedBits();
}